

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O0

void generate_table_filename(char *sort,uint time_iter,uint global_iteration,char *filename)

{
  char local_68 [8];
  char dirname [64];
  char *filename_local;
  uint global_iteration_local;
  uint time_iter_local;
  char *sort_local;
  
  mkdir("results",0x1c0);
  mkdir("results/dat",0x1c0);
  memset(local_68,0,0x40);
  snprintf(local_68,0x40,"results/dat/%u",(ulong)global_iteration);
  mkdir(local_68,0x1c0);
  snprintf(filename,0x40,"results/dat/%u/%s_at_%u_iteration.dat",(ulong)global_iteration,sort,
           (ulong)time_iter);
  return;
}

Assistant:

void generate_table_filename (char const * sort,
                              unsigned time_iter,
                              unsigned global_iteration,
                              char * filename) {

  mkdir ("results", S_IRWXU);
  mkdir ("results/dat", S_IRWXU);

  char dirname[MAX_FILENAME_SIZE] = "";
  snprintf(dirname, MAX_FILENAME_SIZE, "results/dat/%u", global_iteration);
  mkdir (dirname, S_IRWXU);

  snprintf (filename, 
            MAX_FILENAME_SIZE, 
            "results/dat/%u/%s_at_%u_iteration.dat", 
            global_iteration, 
            sort, 
            time_iter);
  return;
}